

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O2

bool __thiscall spvtools::AssemblyContext::isStartOfNewInst(AssemblyContext *this)

{
  spv_text text;
  bool bVar1;
  spv_result_t sVar2;
  spv_position_t pos;
  string word;
  spv_position_t local_58;
  string local_38;
  
  local_58.index = (this->current_position_).index;
  local_58.line = (this->current_position_).line;
  local_58.column = (this->current_position_).column;
  sVar2 = anon_unknown_6::advance(this->text_,&local_58);
  if (sVar2 != SPV_SUCCESS) {
    return false;
  }
  text = this->text_;
  bVar1 = anon_unknown_6::startsWithOp(text,&local_58);
  if (!bVar1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_58.line = (this->current_position_).line;
    local_58.column = (this->current_position_).column;
    local_58.index = (this->current_position_).index;
    sVar2 = anon_unknown_6::getWord(text,&local_58,&local_38);
    if ((((sVar2 != SPV_SUCCESS) || (*local_38._M_dataplus._M_p != '%')) ||
        (sVar2 = anon_unknown_6::advance(this->text_,&local_58), sVar2 != SPV_SUCCESS)) ||
       (((sVar2 = anon_unknown_6::getWord(this->text_,&local_58,&local_38), sVar2 != SPV_SUCCESS ||
         (bVar1 = std::operator!=("=",&local_38), bVar1)) ||
        (sVar2 = anon_unknown_6::advance(this->text_,&local_58), sVar2 != SPV_SUCCESS)))) {
      bVar1 = false;
    }
    else {
      bVar1 = anon_unknown_6::startsWithOp(this->text_,&local_58);
    }
    std::__cxx11::string::_M_dispose();
    return bVar1;
  }
  return true;
}

Assistant:

bool AssemblyContext::isStartOfNewInst() {
  spv_position_t pos = current_position_;
  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::startsWithOp(text_, &pos)) return true;

  std::string word;
  pos = current_position_;
  if (spvtools::getWord(text_, &pos, &word)) return false;
  if ('%' != word.front()) return false;

  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::getWord(text_, &pos, &word)) return false;
  if ("=" != word) return false;

  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::startsWithOp(text_, &pos)) return true;
  return false;
}